

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O0

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,
          double weight)

{
  PlanningUnitDecPOMDPDiscrete *arg;
  size_t __n;
  undefined8 uVar1;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_RSI;
  E *in_RDI;
  double in_XMM0_Qa;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_00000010;
  void **in_stack_00000018;
  AlphaVectorBG *in_stack_00000020;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_00000078;
  AlphaVectorPlanning *in_stack_00000080;
  AlphaVectorPlanning *in_stack_ffffffffffffff98;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffa8;
  value_type_conflict3 *__value;
  E *this_00;
  value_type_conflict3 local_25;
  double local_18;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  AlphaVectorPlanning::AlphaVectorPlanning(in_stack_00000080,in_stack_00000078);
  AlphaVectorPOMDP::AlphaVectorPOMDP
            ((AlphaVectorPOMDP *)in_RDI,&PTR_construction_vtable_24__00d114a0,local_10);
  AlphaVectorBG::AlphaVectorBG(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  in_RDI->_vptr_E = (_func_int **)&PTR__AlphaVectorWeighted_00d11438;
  *(undefined ***)&in_RDI[2]._m_error = &PTR__AlphaVectorWeighted_00d11488;
  *(undefined ***)&in_RDI->_m_error = &PTR__AlphaVectorWeighted_00d11460;
  this_00 = in_RDI + 1;
  arg = AlphaVectorPlanning::GetPU(in_stack_ffffffffffffff98);
  __n = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffffa0);
  __value = &local_25;
  std::allocator<double>::allocator((allocator<double> *)0x957733);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,__n,__value,
             in_stack_ffffffffffffffa8);
  std::allocator<double>::~allocator((allocator<double> *)0x957758);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x95776b);
  if ((0.0 <= local_18) && (local_18 <= 1.0)) {
    BackProjectWeights((AlphaVectorWeighted *)in_stack_00000020);
    return;
  }
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(in_RDI,(char *)arg);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
                    double weight) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_weights(GetPU()->GetNrStates(),weight)
{
    if(weight < 0 || weight > 1)
        throw(E("AlphaVectorWeighted ctor: weight should be >=0 and <=1"));
    BackProjectWeights();
}